

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dump.hpp
# Opt level: O1

string * __thiscall
ELFIO::dump::find_value_in_table<ELFIO::version_table_t[2],unsigned_int>
          (string *__return_storage_ptr__,dump *this,version_table_t (*table) [2],uint *key)

{
  char *__s;
  char *pcVar1;
  long lVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"?","");
  lVar2 = 0;
  do {
    if (*(Elf64_Word *)(this + lVar2) == (*table)[0].key) {
      __s = *(char **)(this + lVar2 + 8);
      pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(__s);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)__s);
      return __return_storage_ptr__;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 == 0x10);
  return __return_storage_ptr__;
}

Assistant:

std::string static find_value_in_table( const T& table, const K& key )
    {
        std::string res = "?";
        for ( unsigned int i = 0; i < sizeof( table ) / sizeof( table[0] );
              ++i ) {
            if ( table[i].key == key ) {
                res = table[i].str;
                break;
            }
        }

        return res;
    }